

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O2

char * flatcc_json_parser_array_end(flatcc_json_parser_t *ctx,char *buf,char *end,int *more)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  
  pcVar1 = flatcc_json_parser_space(ctx,buf,end);
  if (pcVar1 == end) {
    *more = 0;
    return pcVar1;
  }
  if (*pcVar1 == ',') {
    pcVar1 = flatcc_json_parser_space(ctx,pcVar1 + 1,end);
    if (pcVar1 != end) {
      if (*pcVar1 != ']') {
        *more = 1;
        return pcVar1;
      }
      *more = 0;
LAB_001182ae:
      pcVar1 = flatcc_json_parser_space(ctx,pcVar1 + 1,end);
      return pcVar1;
    }
    *more = 0;
    if (ctx->error != 0) {
      return end;
    }
    ctx->error = 9;
    iVar2 = *(int *)&ctx->line_start;
    iVar3 = (int)end;
  }
  else {
    *more = 0;
    if (*pcVar1 == ']') goto LAB_001182ae;
    if (ctx->error != 0) {
      return end;
    }
    ctx->error = 9;
    iVar2 = *(int *)&ctx->line_start;
    iVar3 = (int)pcVar1;
  }
  ctx->pos = (iVar3 - iVar2) + 1;
  ctx->error_loc = pcVar1;
  return end;
}

Assistant:

static inline const char *flatcc_json_parser_array_end(flatcc_json_parser_t *ctx, const char *buf,
        const char *end, int *more)
{
    buf = flatcc_json_parser_space(ctx, buf, end);
    if (buf == end) {
        *more = 0;
        return buf;
    }
    if (*buf != ',') {
        *more = 0;
        if (*buf != ']') {
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unbalanced_array);
        } else {
            return flatcc_json_parser_space(ctx, buf + 1, end);
        }
    }
    buf = flatcc_json_parser_space(ctx, buf + 1, end);
    if (buf == end) {
        *more = 0;
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unbalanced_array);
    }
#if FLATCC_JSON_PARSE_ALLOW_TRAILING_COMMA
    if (*buf == ']') {
        *more = 0;
        return flatcc_json_parser_space(ctx, buf + 1, end);
    }
#endif
    *more = 1;
    return buf;
}